

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O2

void mod2dense_set(mod2dense *m,int row,int col,int value)

{
  uint uVar1;
  uint uVar2;
  
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    uVar1 = m->col[(uint)col][(uint)row >> 5];
    uVar2 = uVar1 & ~(1 << (row & 0x1fU));
    if (value != 0) {
      uVar2 = uVar1 | 1 << (row & 0x1fU);
    }
    m->col[(uint)col][(uint)row >> 5] = uVar2;
    return;
  }
  fwrite("mod2dense_set: row or column index out of bounds\n",0x31,1,_stderr);
  exit(1);
}

Assistant:

void mod2dense_set 
( mod2dense *m, 	/* Matrix to modify element of */
  int row,		/* Row of element (starting with zero) */
  int col,		/* Column of element (starting with zero) */
  int value		/* New value of element (0 or 1) */
)
{ 
  mod2word *w;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_set: row or column index out of bounds\n");
    exit(1);
  }

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = value ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
             : mod2_setbit0(*w,row&mod2_wordsize_mask);
}